

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::loadConstructedPoint<(TasGrid::RuleLocal::erule)1>
          (GridLocalPolynomial *this,double *x,int numx,double *y)

{
  size_t *psVar1;
  undefined8 *puVar2;
  int iVar3;
  SimpleConstructData *pSVar4;
  long lVar5;
  long lVar6;
  int i;
  long lVar7;
  ulong uVar8;
  Data2D<int> combined_pnts;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  pnts;
  undefined1 local_d8 [56];
  ulong local_a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_98;
  MultiIndexSet local_80;
  MultiIndexSet local_58;
  
  iVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_98,(long)numx,(allocator_type *)local_d8);
  lVar7 = 0;
  local_a0 = 0;
  if (0 < numx) {
    local_a0 = (ulong)(uint)numx;
  }
  lVar5 = local_a0 * 0x18;
  for (; lVar5 != lVar7; lVar7 = lVar7 + 0x18) {
    getMultiIndex<(TasGrid::RuleLocal::erule)1>
              ((vector<int,_std::allocator<int>_> *)local_d8,this,x);
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)
               ((long)&((local_98.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar7),(allocator_type *)local_d8);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_d8);
    x = x + iVar3;
  }
  pSVar4 = (this->dynamic_values)._M_t.
           super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
           .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
  if (*(pointer *)
       &(pSVar4->initial_points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl !=
      *(pointer *)((long)&(pSVar4->initial_points).indexes + 8)) {
    Data2D<int>::Data2D<int,int>
              ((Data2D<int> *)local_d8,(this->super_BaseCanonicalGrid).num_dimensions,numx);
    lVar7 = 0;
    for (uVar8 = 0; local_a0 != uVar8; uVar8 = uVar8 + 1) {
      lVar6 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
      if (0 < lVar6) {
        memmove((pointer)(local_d8._16_8_ + local_d8._0_8_ * uVar8 * 4),
                *(void **)((long)&((local_98.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar7),lVar6 << 2);
      }
      lVar7 = lVar7 + 0x18;
    }
    pSVar4 = (this->dynamic_values)._M_t.
             super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
             .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
    MultiIndexSet::MultiIndexSet(&local_58,(Data2D<int> *)local_d8);
    MultiIndexSet::operator-(&local_80,&pSVar4->initial_points,&local_58);
    MultiIndexSet::operator=
              (&((this->dynamic_values)._M_t.
                 super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
                 .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->
                initial_points,&local_80);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_80.indexes.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_58.indexes.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)(local_d8 + 0x10));
  }
  iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
  for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 0x18) {
    pSVar4 = (this->dynamic_values)._M_t.
             super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
             .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
    psVar1 = (size_t *)
             ((long)&((local_98.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start + lVar7);
    local_d8._0_8_ = *psVar1;
    local_d8._8_8_ = psVar1[1];
    local_d8._16_8_ =
         *(long *)((long)&((local_98.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage + lVar7);
    *(undefined8 *)
     ((long)&((local_98.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage + lVar7) = 0;
    puVar2 = (undefined8 *)
             ((long)&((local_98.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start + lVar7);
    *puVar2 = 0;
    puVar2[1] = 0;
    ::std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)(local_d8 + 0x18),y,
               y + (this->super_BaseCanonicalGrid).num_outputs,(allocator_type *)&local_80);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::push_front
              (&pSVar4->data,(NodeData *)local_d8);
    NodeData::~NodeData((NodeData *)local_d8);
    y = y + iVar3;
  }
  loadConstructedPoints<(TasGrid::RuleLocal::erule)1>(this);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void GridLocalPolynomial::loadConstructedPoint(const double x[], int numx, const double y[]){
    Utils::Wrapper2D<const double> wrapx(num_dimensions, x);
    std::vector<std::vector<int>> pnts(numx);
    #pragma omp parallel for
    for(int i=0; i<numx; i++)
        pnts[i] = getMultiIndex<effrule>(wrapx.getStrip(i));

    if (!dynamic_values->initial_points.empty()){
        Data2D<int> combined_pnts(num_dimensions, numx);
        for(int i=0; i<numx; i++)
            std::copy_n(pnts[i].begin(), num_dimensions, combined_pnts.getIStrip(i));
        dynamic_values->initial_points = dynamic_values->initial_points - combined_pnts;
    }

    Utils::Wrapper2D<const double> wrapy(num_outputs, y);
    for(int i=0; i<numx; i++)
        dynamic_values->data.push_front({std::move(pnts[i]), std::vector<double>(wrapy.getStrip(i), wrapy.getStrip(i) + num_outputs)});

    loadConstructedPoints<effrule>();
}